

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetNetworksByAliases
          (Registry *this,StringArray *aAliases,NetworkArray *aRet,StringArray *aUnresolved)

{
  Network *pNVar1;
  pointer pNVar2;
  pointer pNVar3;
  undefined4 uVar4;
  vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>
  *pvVar5;
  __type_conflict1 _Var6;
  Status SVar7;
  bool bVar8;
  long lVar9;
  ulong uVar10;
  Network *pNVar11;
  Network *pNVar12;
  long lVar13;
  Status unaff_BL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *pcVar14;
  const_iterator cVar15;
  __normal_iterator<ot::commissioner::persistent_storage::Network_*,_std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>_>
  __i;
  pointer pNVar16;
  Network *this_00;
  NetworkArray networks;
  uint16_t pid;
  StringArray *local_128;
  undefined1 local_120 [8];
  char *local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>
  *local_f8;
  StringArray *local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  undefined1 local_e0 [40];
  uint64_t xpid;
  string aliasAsPanId;
  Network nwkThis;
  
  networks.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  networks.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  networks.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __lhs = (aAliases->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  local_e8 = (aAliases->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  SVar7 = kError;
  local_128 = aUnresolved;
  pvVar5 = (vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>
            *)aRet;
  if (local_e8 != __lhs) {
    while( true ) {
      local_f8 = pvVar5;
      if (__lhs == local_e8) break;
      _Var6 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(anonymous_namespace)::ALIAS_ALL_abi_cxx11_);
      if ((_Var6) ||
         (_Var6 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)(anonymous_namespace)::ALIAS_OTHER_abi_cxx11_), _Var6)) {
        SVar7 = kError;
        if (((long)(aAliases->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(aAliases->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start != 0x20) ||
           (SVar7 = GetAllNetworks(this,&networks), SVar7 != kSuccess)) goto LAB_00212965;
        _Var6 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)(anonymous_namespace)::ALIAS_OTHER_abi_cxx11_);
        if (_Var6) {
          Network::Network(&nwkThis);
          SVar7 = GetCurrentNetwork(this,&nwkThis);
          if (SVar7 != kSuccess) {
            Network::~Network(&nwkThis);
            goto LAB_00212965;
          }
          lVar13 = (long)networks.
                         super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)networks.
                         super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          cVar15._M_current =
               networks.
               super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
               ._M_impl.super__Vector_impl_data._M_start;
          for (lVar9 = lVar13 / 0x60 >> 2; 0 < lVar9; lVar9 = lVar9 + -1) {
            if (nwkThis.mId.mId == ((cVar15._M_current)->mId).mId) goto LAB_002127e0;
            if (nwkThis.mId.mId == cVar15._M_current[1].mId.mId) {
              cVar15._M_current = cVar15._M_current + 1;
              goto LAB_002127e0;
            }
            if (nwkThis.mId.mId == cVar15._M_current[2].mId.mId) {
              cVar15._M_current = cVar15._M_current + 2;
              goto LAB_002127e0;
            }
            if (nwkThis.mId.mId == cVar15._M_current[3].mId.mId) {
              cVar15._M_current = cVar15._M_current + 3;
              goto LAB_002127e0;
            }
            cVar15._M_current = cVar15._M_current + 4;
            lVar13 = lVar13 + -0x180;
          }
          lVar13 = lVar13 / 0x60;
          if (lVar13 == 1) {
LAB_002127c1:
            if (nwkThis.mId.mId != ((cVar15._M_current)->mId).mId) {
              cVar15._M_current =
                   networks.
                   super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
            }
LAB_002127e0:
            if (cVar15._M_current !=
                networks.
                super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              std::
              vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
              ::erase(&networks,cVar15);
            }
          }
          else {
            if (lVar13 == 2) {
LAB_002127b8:
              if (nwkThis.mId.mId != ((cVar15._M_current)->mId).mId) {
                cVar15._M_current = cVar15._M_current + 1;
                goto LAB_002127c1;
              }
              goto LAB_002127e0;
            }
            if (lVar13 == 3) {
              if (nwkThis.mId.mId != ((cVar15._M_current)->mId).mId) {
                cVar15._M_current = cVar15._M_current + 1;
                goto LAB_002127b8;
              }
              goto LAB_002127e0;
            }
          }
          Network::~Network(&nwkThis);
        }
        unaff_BL = kSuccess;
      }
      else {
        _Var6 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)(anonymous_namespace)::ALIAS_THIS_abi_cxx11_);
        if (_Var6) {
          Network::Network(&nwkThis);
          unaff_BL = GetCurrentNetwork(this,&nwkThis);
          if ((unaff_BL == kSuccess) && (nwkThis.mId.mId != 0xffffffff)) {
            std::
            vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ::push_back(&networks,&nwkThis);
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(local_128,__lhs);
          }
        }
        else {
          Network::Network(&nwkThis);
          utils::ParseInteger<unsigned_long>((Error *)local_e0,&xpid,__lhs);
          uVar4 = local_e0._0_4_;
          local_120._0_4_ = 0;
          local_118 = local_110._M_local_buf + 8;
          local_110._M_allocated_capacity = 0;
          local_110._M_local_buf[8] = '\0';
          std::__cxx11::string::~string((string *)&local_118);
          std::__cxx11::string::~string((string *)(local_e0 + 8));
          if (((uVar4 != kNone) || (SVar7 = GetNetworkByXpan(this,xpid,&nwkThis), SVar7 != kSuccess)
              ) && (unaff_BL = GetNetworkByName(this,__lhs,&nwkThis), unaff_BL != kSuccess)) {
            std::__cxx11::string::substr((ulong)local_120,(ulong)__lhs);
            utils::ToLower((string *)local_e0,(string *)local_120);
            local_f0 = aAliases;
            bVar8 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_e0,"0x");
            std::__cxx11::string::~string((string *)local_e0);
            std::__cxx11::string::~string((string *)local_120);
            pcVar14 = "";
            if (bVar8) {
              pcVar14 = "0x";
            }
            std::__cxx11::string::string((string *)local_e0,pcVar14,(allocator *)local_120);
            std::operator+(&aliasAsPanId,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_e0,__lhs);
            std::__cxx11::string::~string((string *)local_e0);
            utils::ParseInteger<unsigned_short>((Error *)local_e0,&pid,&aliasAsPanId);
            uVar4 = local_e0._0_4_;
            aAliases = local_f0;
            local_120._0_4_ = 0;
            local_118 = local_110._M_local_buf + 8;
            local_110._M_allocated_capacity = 0;
            local_110._M_local_buf[8] = '\0';
            std::__cxx11::string::~string((string *)&local_118);
            std::__cxx11::string::~string((string *)(local_e0 + 8));
            if (uVar4 == kNone) {
              unaff_BL = GetNetworkByPan(this,&aliasAsPanId,&nwkThis);
            }
            std::__cxx11::string::~string((string *)&aliasAsPanId);
            if (unaff_BL != kSuccess) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(local_128,__lhs);
              goto LAB_00212808;
            }
          }
          std::
          vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          ::push_back(&networks,&nwkThis);
          unaff_BL = kSuccess;
        }
LAB_00212808:
        Network::~Network(&nwkThis);
      }
      pNVar3 = networks.
               super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pNVar2 = networks.
               super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (networks.
          super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          networks.
          super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        lVar13 = (long)networks.
                       super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)networks.
                       super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        uVar10 = lVar13 / 0x60;
        lVar9 = 0x3f;
        if (uVar10 != 0) {
          for (; uVar10 >> lVar9 == 0; lVar9 = lVar9 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::Network*,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<ot::commissioner::persistent_storage::Registry::GetNetworksByAliases(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>>
                  (networks.
                   super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   networks.
                   super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                   ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar13 < 0x601) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::Network*,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>>,__gnu_cxx::__ops::_Iter_comp_iter<ot::commissioner::persistent_storage::Registry::GetNetworksByAliases(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>>
                    (pNVar2,pNVar3);
        }
        else {
          pNVar16 = pNVar2 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::Network*,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>>,__gnu_cxx::__ops::_Iter_comp_iter<ot::commissioner::persistent_storage::Registry::GetNetworksByAliases(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>>
                    (pNVar2,pNVar16);
          for (; pNVar16 != pNVar3; pNVar16 = pNVar16 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::Network*,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>>,__gnu_cxx::__ops::_Val_comp_iter<ot::commissioner::persistent_storage::Registry::GetNetworksByAliases(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>>
                      (pNVar16);
          }
        }
      }
      pNVar2 = networks.
               super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pNVar12 = networks.
                super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                ._M_impl.super__Vector_impl_data._M_start;
      cVar15._M_current =
           networks.
           super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (networks.
          super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          networks.
          super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          this_00 = pNVar12;
          pNVar12 = this_00 + 1;
          if (pNVar12 ==
              networks.
              super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
              ._M_impl.super__Vector_impl_data._M_finish) goto LAB_002128fe;
        } while (this_00->mXpan != this_00[1].mXpan);
        while (pNVar11 = pNVar12 + 1, pNVar11 != pNVar2) {
          pNVar1 = pNVar12 + 1;
          pNVar12 = pNVar11;
          if (this_00->mXpan != pNVar1->mXpan) {
            this_00 = this_00 + 1;
            Network::operator=(this_00,pNVar11);
          }
        }
        cVar15._M_current = this_00 + 1;
      }
LAB_002128fe:
      std::
      vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
      ::erase(&networks,cVar15,
              (const_iterator)
              networks.
              super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
              ._M_impl.super__Vector_impl_data._M_finish);
      __lhs = __lhs + 1;
      pvVar5 = local_f8;
    }
    std::
    vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>
    ::
    insert<__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::Network*,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>>,void>
              (local_f8,*(Network **)(local_f8 + 8),
               (__normal_iterator<ot::commissioner::persistent_storage::Network_*,_std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>_>
                )networks.
                 super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<ot::commissioner::persistent_storage::Network_*,_std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>_>
                )networks.
                 super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    SVar7 = unaff_BL;
    if (networks.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        networks.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      SVar7 = kSuccess;
    }
  }
LAB_00212965:
  std::
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ::~vector(&networks);
  return SVar7;
}

Assistant:

Registry::Status Registry::GetNetworksByAliases(const StringArray &aAliases,
                                                NetworkArray      &aRet,
                                                StringArray       &aUnresolved)
{
    Registry::Status status;
    NetworkArray     networks;

    if (aAliases.size() == 0)
        return Registry::Status::kError;

    for (const auto &alias : aAliases)
    {
        if (alias == ALIAS_ALL || alias == ALIAS_OTHER)
        {
            VerifyOrExit(aAliases.size() == 1,
                         status = Registry::Status::kError); // Interpreter must have taken care of this
            VerifyOrExit((status = GetAllNetworks(networks)) == Registry::Status::kSuccess);
            if (alias == ALIAS_OTHER)
            {
                Network nwkThis;
                VerifyOrExit((status = GetCurrentNetwork(nwkThis)) == Registry::Status::kSuccess);
                auto nwkIter = find_if(networks.begin(), networks.end(),
                                       [&nwkThis](const Network &el) { return nwkThis.mId.mId == el.mId.mId; });
                if (nwkIter != networks.end())
                {
                    networks.erase(nwkIter);
                }
            }
        }
        else if (alias == ALIAS_THIS)
        {
            // Get selected nwk xpan (no selected is an error)
            Network nwkThis;
            status = GetCurrentNetwork(nwkThis);
            if (status == Registry::Status::kSuccess && nwkThis.mId.mId != EMPTY_ID)
            {
                // Put nwk into networks
                networks.push_back(nwkThis);
            }
            else // failed 'this' must not break the translation flow
            {
                aUnresolved.push_back(alias);
            }
        }
        else
        {
            Network  nwk;
            uint64_t xpid;
            uint16_t pid;

            status = Registry::Status::kNotFound;
            if (utils::ParseInteger(xpid, alias) == ERROR_NONE)
            {
                status = GetNetworkByXpan(xpid, nwk);
            }

            if (status != Registry::Status::kSuccess)
            {
                status = GetNetworkByName(alias, nwk);
            }

            if (status != Registry::Status::kSuccess)
            {
                bool        hasHexPrefix = utils::ToLower(alias.substr(0, 2)) != "0x";
                std::string aliasAsPanId = std::string(hasHexPrefix ? "0x" : "") + alias;

                if (utils::ParseInteger(pid, aliasAsPanId) == ERROR_NONE)
                {
                    status = GetNetworkByPan(aliasAsPanId, nwk);
                }
            }

            if (status == Registry::Status::kSuccess)
            {
                networks.push_back(nwk);
            }
            else // aUnresolved alias must not break processing
            {
                aUnresolved.push_back(alias);
            }
        }

        // Make results unique
        std::sort(networks.begin(), networks.end(),
                  [](Network const &a, Network const &b) { return a.mXpan < b.mXpan; });
        auto last = std::unique(networks.begin(), networks.end(),
                                [](Network const &a, Network const &b) { return a.mXpan == b.mXpan; });
        networks.erase(last, networks.end());
    }

    aRet.insert(aRet.end(), networks.begin(), networks.end());
    if (networks.size() > 0)
    {
        status = Registry::Status::kSuccess;
    }
exit:
    return status;
}